

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

void sysbvm_astInterpreter_setupASTInterpreter(sysbvm_context_t *context)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"loadSourceNamedWithSolvedPath:",1,4,(void *)0x0,
             sysbvm_interpreter_primitive_loadSourceNamedWithSolvedPath);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"loadSourceNamed:",2,1,(void *)0x0,
             sysbvm_interpreter_primitive_loadSourceNamedMacro);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"begin",2,3,(void *)0x0,sysbvm_astSequenceNode_primitiveMacro);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionType,"ensureAnalysis",1,0,(void *)0x0,
             sysbvm_function_primitiveEnsureAnalysis);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionDefinitionType,"ensureTypeAnalysis",1,4,(void *)0x0,
             sysbvm_functionDefinition_primitiveEnsureTypeAnalysis);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).functionDefinitionType,"ensureAnalysis",1,4,(void *)0x0,
             sysbvm_functionDefinition_primitiveEnsureAnalysis);
  sVar1 = (context->roots).simpleFunctionTypeType;
  sVar2 = sysbvm_function_createPrimitive
                    (context,3,0,(void *)0x0,
                     sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode);
  sysbvm_type_setAnalyzeAndTypeCheckFunctionApplicationNodeWithEnvironment(context,sVar1,sVar2);
  sVar1 = (context->roots).simpleFunctionTypeType;
  sVar2 = sysbvm_function_createPrimitive
                    (context,3,0,(void *)0x0,
                     sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode);
  sysbvm_type_setAnalyzeAndTypeCheckMessageSendNodeWithEnvironment(context,sVar1,sVar2);
  sVar1 = (context->roots).dependentFunctionTypeType;
  sVar2 = sysbvm_function_createPrimitive
                    (context,3,0,(void *)0x0,
                     sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode
                    );
  sysbvm_type_setAnalyzeAndTypeCheckFunctionApplicationNodeWithEnvironment(context,sVar1,sVar2);
  sVar1 = (context->roots).dependentFunctionTypeType;
  sVar2 = sysbvm_function_createPrimitive
                    (context,3,0,(void *)0x0,
                     sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode);
  sysbvm_type_setAnalyzeAndTypeCheckMessageSendNodeWithEnvironment(context,sVar1,sVar2);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astArgumentNodeType,sysbvm_astArgumentNode_primitiveAnalyze,
             (sysbvm_functionEntryPoint_t)0x0,(sysbvm_functionEntryPoint_t)0x0);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"tuple:coerceTo:",3,1,(void *)0x0,sysbvm_astCoerceValueNode_primitiveMacro);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astCoerceValueNodeType,
             sysbvm_astCoerceValueNode_primitiveAnalyze,sysbvm_astCoerceValueNode_primitiveEvaluate,
             sysbvm_astCoerceValueNode_primitiveAnalyzeAndEvaluate);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"tuple:downCastTo:",3,1,(void *)0x0,sysbvm_astDownCastNode_primitiveMacro);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astDownCastNodeType,sysbvm_astDownCastNode_primitiveAnalyze,
             sysbvm_astDownCastNode_primitiveEvaluate,
             sysbvm_astDownCastNode_primitiveAnalyzeAndEvaluate);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astErrorNodeType,sysbvm_astErrorNode_primitiveEvaluate,
             sysbvm_astErrorNode_primitiveEvaluate,sysbvm_astErrorNode_primitiveEvaluate);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astPragmaNodeType,sysbvm_astPragmaNode_primitiveAnalyze,
             (sysbvm_functionEntryPoint_t)0x0,(sysbvm_functionEntryPoint_t)0x0);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astSequenceNodeType,sysbvm_astSequenceNode_primitiveAnalyze,
             sysbvm_astSequenceNode_primitiveEvaluate,
             sysbvm_astSequenceNode_primitiveAnalyzeAndEvaluate);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astLiteralNodeType,sysbvm_astLiteralNode_primitiveAnalyze,
             sysbvm_astLiteralNode_primitiveEvaluate,sysbvm_astLiteralNode_primitiveEvaluate);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astIdentifierReferenceNodeType,
             sysbvm_astIdentifierReferenceNode_primitiveAnalyze,
             sysbvm_astIdentifierReferenceNode_primitiveEvaluate,
             sysbvm_astIdentifierReferenceNode_primitiveAnalyzeAndEvaluate);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astUnexpandedApplicationNodeType,
             sysbvm_astUnexpandedApplicationNode_primitiveAnalyze,(sysbvm_functionEntryPoint_t)0x0,
             sysbvm_astUnexpandedApplicationNode_primitiveAnalyzeAndEvaluate);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astUnexpandedSExpressionNodeType,
             sysbvm_astUnexpandedSExpressionNode_primitiveAnalyze,(sysbvm_functionEntryPoint_t)0x0,
             sysbvm_astUnexpandedSExpressionNode_primitiveAnalyzeAndEvaluate);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astFunctionApplicationNodeType,
             sysbvm_astFunctionApplicationNode_primitiveAnalyze,
             sysbvm_astFunctionApplicationNode_primitiveEvaluate,
             sysbvm_astFunctionApplicationNode_primitiveAnalyzeAndEvaluate);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astLexicalBlockNodeType,
             sysbvm_astLexicalBlockNode_primitiveAnalyze,
             sysbvm_astLexicalBlockNode_primitiveEvaluate,
             sysbvm_astLexicalBlockNode_primitiveAnalyzeAndEvaluate);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astMakeAssociationNodeType,
             sysbvm_astMakeAssociationNode_primitiveAnalyze,
             sysbvm_astMakeAssociationNode_primitiveEvaluate,
             sysbvm_astMakeAssociationNode_primitiveAnalyzeAndEvaluate);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astMakeByteArrayNodeType,
             sysbvm_astMakeByteArrayNode_primitiveAnalyze,
             sysbvm_astMakeByteArrayNode_primitiveEvaluate,
             sysbvm_astMakeByteArrayNode_primitiveAnalyzeAndEvaluate);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astMakeDictionaryNodeType,
             sysbvm_astMakeDictionaryNode_primitiveAnalyze,
             sysbvm_astMakeDictionaryNode_primitiveEvaluate,
             sysbvm_astMakeDictionaryNode_primitiveAnalyzeAndEvaluate);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astMakeArrayNodeType,sysbvm_astMakeArrayNode_primitiveAnalyze,
             sysbvm_astMakeArrayNode_primitiveEvaluate,
             sysbvm_astMakeArrayNode_primitiveAnalyzeAndEvaluate);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astMessageChainNodeType,
             sysbvm_astMessageChainNode_primitiveAnalyze,
             sysbvm_astMessageChainNode_primitiveEvaluate,
             sysbvm_astMessageChainNode_primitiveAnalyzeAndEvaluate);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astMessageSendNodeType,
             sysbvm_astMessageSendNode_primitiveAnalyze,sysbvm_astMessageSendNode_primitiveEvaluate,
             sysbvm_astMessageSendNode_primitiveAnalyzeAndEvaluate);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astLambdaNodeType,sysbvm_astLambdaNode_primitiveAnalyze,
             sysbvm_astLambdaNode_primitiveEvaluate,sysbvm_astLambdaNode_primitiveAnalyzeAndEvaluate
            );
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"let:with:",3,1,(void *)0x0,
             sysbvm_astVariableDefinitionNode_letWithPrimitiveMacro);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"let:type:with:",4,1,(void *)0x0,
             sysbvm_astVariableDefinitionNode_letTypeWithPrimitiveMacro);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"let:mutableWith:",3,1,(void *)0x0,
             sysbvm_astVariableDefinitionNode_letMutableWithPrimitiveMacro);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"let:type:mutableWith:",4,1,(void *)0x0,
             sysbvm_astVariableDefinitionNode_letTypeMutableWithPrimitiveMacro);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"macroLet:with:",3,1,(void *)0x0,
             sysbvm_astVariableDefinitionNode_macroLetWithPrimitiveMacro);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astVariableDefinitionNodeType,
             sysbvm_astVariableDefinitionNode_primitiveAnalyze,
             sysbvm_astVariableDefinitionNode_primitiveEvaluate,
             sysbvm_astVariableDefinitionNode_primitiveAnalyzeAndEvaluate);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"tuple:withLookupStartingFrom:",3,1,(void *)0x0,
             sysbvm_astTupleWithLookupStartingFromNode_primitiveMacro);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astTupleWithLookupStartingFromNodeType,
             sysbvm_astTupleWithLookupStartingFromNode_primitiveAnalyze,
             sysbvm_astTupleWithLookupStartingFromNode_primitiveEvaluate,
             sysbvm_astTupleWithLookupStartingFromNode_primitiveAnalyzeAndEvaluate);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"tuple:slotNamedAt:",(context->roots).anyValueType,"__slotNamedAt__:",3,1,
             (void *)0x0,sysbvm_astTupleSlotNamedAtNode_primitiveMacro);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astTupleSlotNamedAtNodeType,
             sysbvm_astTupleSlotNamedAtNode_primitiveAnalyze,
             sysbvm_astTupleSlotNamedAtNode_primitiveEvaluate,
             sysbvm_astTupleSlotNamedAtNode_primitiveAnalyzeAndEvaluate);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"tuple:slotNamedReferenceAt:",(context->roots).anyValueType,
             "__slotNamedReferenceAt__:",3,1,(void *)0x0,
             sysbvm_astTupleSlotNamedReferenceAtNode_primitiveMacro);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astTupleSlotNamedReferenceAtNodeType,
             sysbvm_astTupleSlotNamedReferenceAtNode_primitiveAnalyze,
             sysbvm_astTupleSlotNamedReferenceAtNode_primitiveEvaluate,
             sysbvm_astTupleSlotNamedReferenceAtNode_primitiveAnalyzeAndEvaluate);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"tuple:slotNamedAt:put:",(context->roots).anyValueType,"__slotNamedAt__:put:",4
             ,1,(void *)0x0,sysbvm_astTupleSlotNamedAtPutNode_primitiveMacro);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astTupleSlotNamedAtPutNodeType,
             sysbvm_astTupleSlotNamedAtPutNode_primitiveAnalyze,
             sysbvm_astTupleSlotNamedAtPutNode_primitiveEvaluate,
             sysbvm_astTupleSlotNamedAtPutNode_primitiveAnalyzeAndEvaluate);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"if:then:else:",4,1,(void *)0x0,sysbvm_astIfNode_primitiveMacro);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"if:then:",3,1,(void *)0x0,sysbvm_astIfNode_primitiveMacroIfThen);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astIfNodeType,sysbvm_astIfNode_primitiveAnalyze,
             sysbvm_astIfNode_primitiveEvaluate,sysbvm_astIfNode_primitiveAnalyzeAndEvaluate);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"do:while:continueWith:",4,1,(void *)0x0,
             sysbvm_astDoWhileContinueWithNode_primitiveMacro);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"do:while:",3,1,(void *)0x0,
             sysbvm_astDoWhileContinueWithNode_primitiveDoWhileMacro);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astDoWhileContinueWithNodeType,
             sysbvm_astDoWhileContinueWithNode_primitiveAnalyze,
             sysbvm_astDoWhileContinueWithNode_primitiveEvaluate,
             sysbvm_astDoWhileContinueWithNode_primitiveAnalyzeAndEvaluate);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod
            (context,"useNamedSlotsOf:",(context->roots).anyValueType,"__useNamedSlots__",2,1,
             (void *)0x0,sysbvm_astUseNamedSlotsOfNode_primitiveMacro);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astUseNamedSlotsOfNodeType,
             sysbvm_astUseNamedSlotsOfNode_primitiveAnalyze,
             sysbvm_astUseNamedSlotsOfNode_primitiveEvaluate,
             sysbvm_astUseNamedSlotsOfNode_primitiveAnalyzeAndEvaluate);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"while:do:continueWith:",4,1,(void *)0x0,
             sysbvm_astWhileContinueWithNode_primitiveMacro);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"while:do:",3,1,(void *)0x0,
             sysbvm_astWhileContinueWithNode_primitiveWhileDoMacro);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astWhileContinueWithNodeType,
             sysbvm_astWhileContinueWithNode_primitiveAnalyze,
             sysbvm_astWhileContinueWithNode_primitiveEvaluate,
             sysbvm_astWhileContinueWithNode_primitiveAnalyzeAndEvaluate);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"break",1,1,(void *)0x0,sysbvm_astBreakNode_primitiveMacro);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astBreakNodeType,sysbvm_astBreakNode_primitiveAnalyze,
             sysbvm_astBreakNode_primitiveEvaluate,sysbvm_astBreakNode_primitiveEvaluate);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"continue",1,1,(void *)0x0,sysbvm_astContinueNode_primitiveMacro);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astContinueNodeType,sysbvm_astContinueNode_primitiveAnalyze,
             sysbvm_astContinueNode_primitiveEvaluate,sysbvm_astContinueNode_primitiveEvaluate);
  sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction
            (context,"return:",2,1,(void *)0x0,sysbvm_astReturnNode_primitiveMacro);
  sysbvm_astInterpreter_setupNodeInterpretationFunctions
            (context,(context->roots).astReturnNodeType,sysbvm_astReturnNode_primitiveAnalyze,
             sysbvm_astReturnNode_primitiveEvaluate,sysbvm_astReturnNode_primitiveAnalyzeAndEvaluate
            );
  return;
}

Assistant:

void sysbvm_astInterpreter_setupASTInterpreter(sysbvm_context_t *context)
{
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "loadSourceNamedWithSolvedPath:", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_interpreter_primitive_loadSourceNamedWithSolvedPath);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "loadSourceNamed:", 2, SYSBVM_FUNCTION_FLAGS_MACRO | SYSBVM_FUNCTION_FLAGS_NONE, NULL, sysbvm_interpreter_primitive_loadSourceNamedMacro);

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "begin", 2, SYSBVM_FUNCTION_FLAGS_MACRO | SYSBVM_FUNCTION_FLAGS_VARIADIC, NULL, sysbvm_astSequenceNode_primitiveMacro);

    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionType, "ensureAnalysis", 1, SYSBVM_FUNCTION_FLAGS_NONE, NULL, sysbvm_function_primitiveEnsureAnalysis);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionDefinitionType, "ensureTypeAnalysis", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_functionDefinition_primitiveEnsureTypeAnalysis);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.functionDefinitionType, "ensureAnalysis", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_functionDefinition_primitiveEnsureAnalysis);

    sysbvm_type_setAnalyzeAndTypeCheckFunctionApplicationNodeWithEnvironment(context, context->roots.simpleFunctionTypeType, sysbvm_function_createPrimitive(context, 3, SYSBVM_FUNCTION_FLAGS_NONE, NULL, sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode));
    sysbvm_type_setAnalyzeAndTypeCheckMessageSendNodeWithEnvironment(context, context->roots.simpleFunctionTypeType, sysbvm_function_createPrimitive(context, 3, SYSBVM_FUNCTION_FLAGS_NONE, NULL, sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode));

    sysbvm_type_setAnalyzeAndTypeCheckFunctionApplicationNodeWithEnvironment(context, context->roots.dependentFunctionTypeType, sysbvm_function_createPrimitive(context, 3, SYSBVM_FUNCTION_FLAGS_NONE, NULL, sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode));
    sysbvm_type_setAnalyzeAndTypeCheckMessageSendNodeWithEnvironment(context, context->roots.dependentFunctionTypeType, sysbvm_function_createPrimitive(context, 3, SYSBVM_FUNCTION_FLAGS_NONE, NULL, sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode));

    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astArgumentNodeType,
        sysbvm_astArgumentNode_primitiveAnalyze,
        NULL,
        NULL
    );

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "tuple:coerceTo:", 3, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astCoerceValueNode_primitiveMacro);
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astCoerceValueNodeType,
        sysbvm_astCoerceValueNode_primitiveAnalyze,
        sysbvm_astCoerceValueNode_primitiveEvaluate,
        sysbvm_astCoerceValueNode_primitiveAnalyzeAndEvaluate
    );

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "tuple:downCastTo:", 3, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astDownCastNode_primitiveMacro);
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astDownCastNodeType,
        sysbvm_astDownCastNode_primitiveAnalyze,
        sysbvm_astDownCastNode_primitiveEvaluate,
        sysbvm_astDownCastNode_primitiveAnalyzeAndEvaluate
    );

    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astErrorNodeType,
        sysbvm_astErrorNode_primitiveEvaluate,
        sysbvm_astErrorNode_primitiveEvaluate,
        sysbvm_astErrorNode_primitiveEvaluate
    );
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astPragmaNodeType,
        sysbvm_astPragmaNode_primitiveAnalyze,
        NULL,
        NULL
    );
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astSequenceNodeType,
        sysbvm_astSequenceNode_primitiveAnalyze,
        sysbvm_astSequenceNode_primitiveEvaluate,
        sysbvm_astSequenceNode_primitiveAnalyzeAndEvaluate
    );
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astLiteralNodeType,
        sysbvm_astLiteralNode_primitiveAnalyze,
        sysbvm_astLiteralNode_primitiveEvaluate,
        sysbvm_astLiteralNode_primitiveEvaluate
    );
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astIdentifierReferenceNodeType,
        sysbvm_astIdentifierReferenceNode_primitiveAnalyze,
        sysbvm_astIdentifierReferenceNode_primitiveEvaluate,
        sysbvm_astIdentifierReferenceNode_primitiveAnalyzeAndEvaluate
    );
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astUnexpandedApplicationNodeType,
        sysbvm_astUnexpandedApplicationNode_primitiveAnalyze,
        NULL,
        sysbvm_astUnexpandedApplicationNode_primitiveAnalyzeAndEvaluate
    );
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astUnexpandedSExpressionNodeType,
        sysbvm_astUnexpandedSExpressionNode_primitiveAnalyze,
        NULL,
        sysbvm_astUnexpandedSExpressionNode_primitiveAnalyzeAndEvaluate
    );
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astFunctionApplicationNodeType,
        sysbvm_astFunctionApplicationNode_primitiveAnalyze,
        sysbvm_astFunctionApplicationNode_primitiveEvaluate,
        sysbvm_astFunctionApplicationNode_primitiveAnalyzeAndEvaluate
    );
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astLexicalBlockNodeType,
        sysbvm_astLexicalBlockNode_primitiveAnalyze,
        sysbvm_astLexicalBlockNode_primitiveEvaluate,
        sysbvm_astLexicalBlockNode_primitiveAnalyzeAndEvaluate
    );
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astMakeAssociationNodeType,
        sysbvm_astMakeAssociationNode_primitiveAnalyze,
        sysbvm_astMakeAssociationNode_primitiveEvaluate,
        sysbvm_astMakeAssociationNode_primitiveAnalyzeAndEvaluate
    );
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astMakeByteArrayNodeType,
        sysbvm_astMakeByteArrayNode_primitiveAnalyze,
        sysbvm_astMakeByteArrayNode_primitiveEvaluate,
        sysbvm_astMakeByteArrayNode_primitiveAnalyzeAndEvaluate
    );
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astMakeDictionaryNodeType,
        sysbvm_astMakeDictionaryNode_primitiveAnalyze,
        sysbvm_astMakeDictionaryNode_primitiveEvaluate,
        sysbvm_astMakeDictionaryNode_primitiveAnalyzeAndEvaluate
    );
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astMakeArrayNodeType,
        sysbvm_astMakeArrayNode_primitiveAnalyze,
        sysbvm_astMakeArrayNode_primitiveEvaluate,
        sysbvm_astMakeArrayNode_primitiveAnalyzeAndEvaluate
    );
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astMessageChainNodeType,
        sysbvm_astMessageChainNode_primitiveAnalyze,
        sysbvm_astMessageChainNode_primitiveEvaluate,
        sysbvm_astMessageChainNode_primitiveAnalyzeAndEvaluate
    );

    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astMessageSendNodeType,
        sysbvm_astMessageSendNode_primitiveAnalyze,
        sysbvm_astMessageSendNode_primitiveEvaluate,
        sysbvm_astMessageSendNode_primitiveAnalyzeAndEvaluate
    );

    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astLambdaNodeType,
        sysbvm_astLambdaNode_primitiveAnalyze,
        sysbvm_astLambdaNode_primitiveEvaluate,
        sysbvm_astLambdaNode_primitiveAnalyzeAndEvaluate
    );

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "let:with:", 3, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astVariableDefinitionNode_letWithPrimitiveMacro);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "let:type:with:", 4, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astVariableDefinitionNode_letTypeWithPrimitiveMacro);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "let:mutableWith:", 3, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astVariableDefinitionNode_letMutableWithPrimitiveMacro);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "let:type:mutableWith:", 4, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astVariableDefinitionNode_letTypeMutableWithPrimitiveMacro);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "macroLet:with:", 3, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astVariableDefinitionNode_macroLetWithPrimitiveMacro);
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astVariableDefinitionNodeType,
        sysbvm_astVariableDefinitionNode_primitiveAnalyze,
        sysbvm_astVariableDefinitionNode_primitiveEvaluate,
        sysbvm_astVariableDefinitionNode_primitiveAnalyzeAndEvaluate
    );

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "tuple:withLookupStartingFrom:", 3, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astTupleWithLookupStartingFromNode_primitiveMacro);
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astTupleWithLookupStartingFromNodeType,
        sysbvm_astTupleWithLookupStartingFromNode_primitiveAnalyze,
        sysbvm_astTupleWithLookupStartingFromNode_primitiveEvaluate,
        sysbvm_astTupleWithLookupStartingFromNode_primitiveAnalyzeAndEvaluate
    );

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "tuple:slotNamedAt:", context->roots.anyValueType, "__slotNamedAt__:", 3, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astTupleSlotNamedAtNode_primitiveMacro);
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astTupleSlotNamedAtNodeType,
        sysbvm_astTupleSlotNamedAtNode_primitiveAnalyze,
        sysbvm_astTupleSlotNamedAtNode_primitiveEvaluate,
        sysbvm_astTupleSlotNamedAtNode_primitiveAnalyzeAndEvaluate
    );

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "tuple:slotNamedReferenceAt:", context->roots.anyValueType, "__slotNamedReferenceAt__:", 3, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astTupleSlotNamedReferenceAtNode_primitiveMacro);
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astTupleSlotNamedReferenceAtNodeType,
        sysbvm_astTupleSlotNamedReferenceAtNode_primitiveAnalyze,
        sysbvm_astTupleSlotNamedReferenceAtNode_primitiveEvaluate,
        sysbvm_astTupleSlotNamedReferenceAtNode_primitiveAnalyzeAndEvaluate
    );

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "tuple:slotNamedAt:put:", context->roots.anyValueType, "__slotNamedAt__:put:", 4, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astTupleSlotNamedAtPutNode_primitiveMacro);
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astTupleSlotNamedAtPutNodeType,
        sysbvm_astTupleSlotNamedAtPutNode_primitiveAnalyze,
        sysbvm_astTupleSlotNamedAtPutNode_primitiveEvaluate,
        sysbvm_astTupleSlotNamedAtPutNode_primitiveAnalyzeAndEvaluate
    );

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "if:then:else:", 4, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astIfNode_primitiveMacro);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "if:then:", 3, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astIfNode_primitiveMacroIfThen);
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astIfNodeType,
        sysbvm_astIfNode_primitiveAnalyze,
        sysbvm_astIfNode_primitiveEvaluate,
        sysbvm_astIfNode_primitiveAnalyzeAndEvaluate
    );

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "do:while:continueWith:", 4, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astDoWhileContinueWithNode_primitiveMacro);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "do:while:", 3, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astDoWhileContinueWithNode_primitiveDoWhileMacro);
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astDoWhileContinueWithNodeType,
        sysbvm_astDoWhileContinueWithNode_primitiveAnalyze,
        sysbvm_astDoWhileContinueWithNode_primitiveEvaluate,
        sysbvm_astDoWhileContinueWithNode_primitiveAnalyzeAndEvaluate
    );

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveMethod(context, "useNamedSlotsOf:", context->roots.anyValueType, "__useNamedSlots__", 2, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astUseNamedSlotsOfNode_primitiveMacro);
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astUseNamedSlotsOfNodeType,
        sysbvm_astUseNamedSlotsOfNode_primitiveAnalyze,
        sysbvm_astUseNamedSlotsOfNode_primitiveEvaluate,
        sysbvm_astUseNamedSlotsOfNode_primitiveAnalyzeAndEvaluate
    );

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "while:do:continueWith:", 4, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astWhileContinueWithNode_primitiveMacro);
    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "while:do:", 3, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astWhileContinueWithNode_primitiveWhileDoMacro);
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astWhileContinueWithNodeType,
        sysbvm_astWhileContinueWithNode_primitiveAnalyze,
        sysbvm_astWhileContinueWithNode_primitiveEvaluate,
        sysbvm_astWhileContinueWithNode_primitiveAnalyzeAndEvaluate
    );

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "break", 1, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astBreakNode_primitiveMacro);
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astBreakNodeType,
        sysbvm_astBreakNode_primitiveAnalyze,
        sysbvm_astBreakNode_primitiveEvaluate,
        sysbvm_astBreakNode_primitiveEvaluate
    );

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "continue", 1, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astContinueNode_primitiveMacro);
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astContinueNodeType,
        sysbvm_astContinueNode_primitiveAnalyze,
        sysbvm_astContinueNode_primitiveEvaluate,
        sysbvm_astContinueNode_primitiveEvaluate
    );

    sysbvm_context_setIntrinsicSymbolBindingValueWithPrimitiveFunction(context, "return:", 2, SYSBVM_FUNCTION_FLAGS_MACRO, NULL, sysbvm_astReturnNode_primitiveMacro);
    sysbvm_astInterpreter_setupNodeInterpretationFunctions(context, context->roots.astReturnNodeType,
        sysbvm_astReturnNode_primitiveAnalyze,
        sysbvm_astReturnNode_primitiveEvaluate,
        sysbvm_astReturnNode_primitiveAnalyzeAndEvaluate
    );
}